

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr.c
# Opt level: O0

void ustr_initChars(UString_conflict *s,char *source,int32_t length,UErrorCode *status)

{
  size_t sVar1;
  uint local_3c;
  UChar local_2e;
  int local_2c;
  UChar charToAppend;
  UErrorCode *pUStack_28;
  int i;
  UErrorCode *status_local;
  char *pcStack_18;
  int32_t length_local;
  char *source_local;
  UString_conflict *s_local;
  
  local_2c = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    s->fChars = (UChar *)0x0;
    s->fCapacity = 0;
    s->fLength = 0;
    pUStack_28 = status;
    status_local._4_4_ = length;
    pcStack_18 = source;
    source_local = (char *)s;
    if (length == -1) {
      sVar1 = strlen(source);
      status_local._4_4_ = (int32_t)sVar1;
    }
    if (*(int *)(source_local + 0xc) < status_local._4_4_) {
      if (status_local._4_4_ < 0x80) {
        local_3c = 0x80;
      }
      else {
        local_3c = status_local._4_4_ * 2 + 0x80U & 0xffffff80;
      }
      ustr_resize((UString_conflict *)source_local,local_3c,pUStack_28);
      if (U_ZERO_ERROR < *pUStack_28) {
        return;
      }
    }
    for (; local_2c < status_local._4_4_; local_2c = local_2c + 1) {
      u_charsToUChars_63(pcStack_18 + local_2c,&local_2e,1);
      ustr_ucat((UString_conflict *)source_local,local_2e,pUStack_28);
    }
  }
  return;
}

Assistant:

U_CFUNC void
ustr_initChars(struct UString *s, const char* source, int32_t length, UErrorCode *status)
{
    int i = 0;
    if (U_FAILURE(*status)) return;
    s->fChars = 0;
    s->fLength = s->fCapacity = 0;
    if (length == -1) {
        length = (int32_t)uprv_strlen(source);
    }
    if(s->fCapacity < length) {
      ustr_resize(s, ALLOCATION(length), status);
      if(U_FAILURE(*status)) return;
    }
    for (; i < length; i++)
    {
      UChar charToAppend;
      u_charsToUChars(source+i, &charToAppend, 1);
      ustr_ucat(s, charToAppend, status);
      /*
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
        ustr_ucat(s, (UChar)(uint8_t)(source[i]), status);
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
        ustr_ucat(s, (UChar)asciiFromEbcdic[(uint8_t)(*cs++)], status);
#else
#   error U_CHARSET_FAMILY is not valid
#endif
      */
    }
}